

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_false>::enumerate
          (DaTrie<false,_false,_false> *this,uint32_t node_pos,string *prefix,
          vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  char *pcVar6;
  string *in_RCX;
  string *in_RDX;
  uint in_ESI;
  ulong __n;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t label;
  uint32_t child_pos;
  uint32_t base;
  uint32_t tail_pos;
  KvPair kv;
  undefined8 in_stack_ffffffffffffff60;
  DaTrie<false,_false,_false> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  uint local_64;
  uint local_58;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar2 = (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_leaf(pvVar4);
  if (bVar1) {
    this_00 = (DaTrie<false,_false,_false> *)&stack0xffffffffffffffb8;
    KvPair::KvPair((KvPair *)0x154281);
    std::__cxx11::string::operator=((string *)this_00,in_RDX);
    bVar1 = is_terminal_(this_00,uVar2);
    if (bVar1) {
      pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
      Bc::value(pvVar4);
    }
    else {
      pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
      local_58 = Bc::value(pvVar4);
      while( true ) {
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(in_RDI + 1),(ulong)local_58);
        if (*pvVar5 == '\0') break;
        __n = (ulong)local_58;
        local_58 = local_58 + 1;
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(in_RDI + 1),__n);
        std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb8,*pvVar5);
      }
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 1),(ulong)local_58);
      std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb8,*pvVar5);
      pcVar6 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x154391);
      utils::extract_value(pcVar6 + (local_58 + 1));
    }
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::push_back
              ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)in_RDI,(value_type *)this_00);
    KvPair::~KvPair((KvPair *)0x1543c5);
  }
  else {
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
    uVar2 = Bc::base(pvVar4);
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar2);
    uVar3 = Bc::check(pvVar4);
    if (uVar3 == in_ESI) {
      enumerate((DaTrie<false,_false,_false> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint32_t)((ulong)in_RDX >> 0x20),in_RCX,
                (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)
                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    for (local_64 = 1; local_64 < 0x100; local_64 = local_64 + 1) {
      pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         (in_RDI,(ulong)(uVar2 ^ local_64));
      uVar3 = Bc::check(pvVar4);
      if (uVar3 == in_ESI) {
        std::operator+(in_stack_ffffffffffffff78,(char)((ulong)in_RDI >> 0x38));
        enumerate((DaTrie<false,_false,_false> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                  (uint32_t)((ulong)in_RDX >> 0x20),in_RCX,
                  (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)
                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
      }
    }
  }
  return;
}

Assistant:

void enumerate(uint32_t node_pos, const std::string& prefix, std::vector<KvPair>& kvs) const {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(!Prefix);

    if (bc_[node_pos].is_leaf()) {
      KvPair kv;
      kv.key = prefix;
      if (is_terminal_(node_pos)) {
        kv.value = bc_[node_pos].value();
      } else {
        auto tail_pos = bc_[node_pos].value();
        while (tail_[tail_pos] != '\0') {
          kv.key += tail_[tail_pos++];
        }
        kv.key += tail_[tail_pos++];
        kv.value = utils::extract_value(tail_.data() + tail_pos);
      }
      kvs.push_back(kv);
      return;
    }

    auto base = bc_[node_pos].base();
    auto child_pos = base ^static_cast<uint8_t>('\0');
    if (bc_[child_pos].check() == node_pos) {
      enumerate(child_pos, prefix, kvs);
    }

    for (uint32_t label = 1; label < 256; ++label) {
      child_pos = base ^ label;
      if (bc_[child_pos].check() == node_pos) {
        enumerate(child_pos, prefix + static_cast<char>(label), kvs);
      }
    }
  }